

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

void cfd::core::MergeWallyMap
               (wally_map *src,wally_map *dst,string *item_name,bool ignore_duplicate_error)

{
  size_t __n;
  uint8_t *puVar1;
  uint8_t *dest;
  size_t dest_len;
  unsigned_long uVar2;
  iterator iVar3;
  int iVar4;
  long *plVar5;
  CfdException *pCVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  wally_map_item *pwVar8;
  unsigned_long *puVar9;
  size_t *psVar10;
  size_t sVar11;
  int ret;
  vector<unsigned_long,_std::allocator<unsigned_long>_> regist_indexes;
  ByteData key;
  int local_bc;
  wally_map *local_b8;
  undefined1 local_b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  wally_map *local_90;
  unsigned_long local_88;
  uint local_7c;
  unsigned_long *local_78;
  iterator iStack_70;
  unsigned_long *local_68;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_68 = (unsigned_long *)0x0;
  local_78 = (unsigned_long *)0x0;
  iStack_70._M_current = (unsigned_long *)0x0;
  local_88 = 0;
  if (dst->num_items != 0) {
    local_7c = (uint)ignore_duplicate_error;
    local_b8 = src;
    local_90 = dst;
    local_58 = item_name;
    do {
      uVar2 = local_88;
      sVar11 = local_b8->num_items;
      if (sVar11 != 0) {
        pwVar8 = local_90->items + local_88;
        __n = pwVar8->key_len;
        psVar10 = &local_b8->items->value_len;
        do {
          if (psVar10[-2] == __n) {
            puVar1 = ((wally_map_item *)(psVar10 + -3))->key;
            iVar4 = bcmp(puVar1,pwVar8->key,__n);
            if (iVar4 == 0) {
              ByteData::ByteData((ByteData *)&local_50,puVar1,(uint32_t)__n);
              puVar1 = (uint8_t *)psVar10[-1];
              sVar11 = *psVar10;
              dest = pwVar8->value;
              dest_len = pwVar8->value_len;
              ByteData::GetHex_abi_cxx11_((string *)local_b0,(ByteData *)&local_50);
              ComparePsbtData(puVar1,sVar11,dest,dest_len,local_58,(string *)local_b0,
                              SUB41(local_7c,0));
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._0_8_ != &local_a0) {
                operator_delete((void *)local_b0._0_8_);
              }
              if (local_50._M_dataplus._M_p != (pointer)0x0) {
                operator_delete(local_50._M_dataplus._M_p);
              }
              goto LAB_001bd5ef;
            }
          }
          psVar10 = psVar10 + 4;
          sVar11 = sVar11 - 1;
        } while (sVar11 != 0);
      }
      if (iStack_70._M_current == local_68) {
        ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_78,iStack_70,
                   &local_88);
      }
      else {
        *iStack_70._M_current = uVar2;
        iStack_70._M_current = iStack_70._M_current + 1;
      }
LAB_001bd5ef:
      iVar3._M_current = iStack_70._M_current;
      local_88 = local_88 + 1;
    } while (local_88 < local_90->num_items);
    puVar9 = local_78;
    iVar4 = local_bc;
    if (local_78 != iStack_70._M_current) {
      do {
        local_bc = iVar4;
        uVar2 = *puVar9;
        pwVar8 = local_90->items;
        local_bc = wally_map_add(local_b8,pwVar8[uVar2].key,pwVar8[uVar2].key_len,
                                 pwVar8[uVar2].value,pwVar8[uVar2].value_len);
        if (local_bc != 0) {
          local_b0._0_8_ = "cfdcore_psbt.cpp";
          local_b0._8_4_ = 0x179;
          local_a0._M_allocated_capacity = 0x21c490;
          logger::log<int&>((CfdSourceLocation *)local_b0,kCfdLogLevelWarning,"wally_map_add NG[{}]"
                            ,&local_bc);
          pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::operator+(&local_50,"psbt add ",local_58);
          plVar5 = (long *)::std::__cxx11::string::append((char *)&local_50);
          local_b0._0_8_ = *plVar5;
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._0_8_ == paVar7) {
            local_a0._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_a0._8_8_ = plVar5[3];
            local_b0._0_8_ = &local_a0;
          }
          else {
            local_a0._M_allocated_capacity = paVar7->_M_allocated_capacity;
          }
          local_b0._8_8_ = plVar5[1];
          *plVar5 = (long)paVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          CfdException::CfdException(pCVar6,kCfdMemoryFullError,(string *)local_b0);
          __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
        }
        puVar9 = puVar9 + 1;
        iVar4 = 0;
      } while (puVar9 != iVar3._M_current);
      local_bc = wally_map_sort(local_b8,0);
      if (local_bc != 0) {
        local_b0._0_8_ = "cfdcore_psbt.cpp";
        local_b0._8_4_ = 0x181;
        local_a0._M_allocated_capacity = 0x21c490;
        logger::log<int&>((CfdSourceLocation *)local_b0,kCfdLogLevelWarning,"wally_map_sort NG[{}]",
                          &local_bc);
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        local_b0._0_8_ = &local_a0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b0,"psbt sort map error.","");
        CfdException::CfdException(pCVar6,kCfdInternalError,(string *)local_b0);
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_bc = 0;
    }
    if (local_78 != (unsigned_long *)0x0) {
      operator_delete(local_78);
    }
  }
  return;
}

Assistant:

void MergeWallyMap(
    struct wally_map *src, const struct wally_map *dst,
    const std::string &item_name, bool ignore_duplicate_error) {
  bool is_find;
  int ret;
  std::vector<size_t> regist_indexes;
  for (size_t dst_idx = 0; dst_idx < dst->num_items; ++dst_idx) {
    auto dst_item = &dst->items[dst_idx];
    is_find = false;
    for (size_t src_idx = 0; src_idx < src->num_items; ++src_idx) {
      auto src_item = &src->items[src_idx];
      if ((src_item->key_len == dst_item->key_len) &&
          (memcmp(src_item->key, dst_item->key, src_item->key_len) == 0)) {
        is_find = true;
        ByteData key(src_item->key, static_cast<uint32_t>(src_item->key_len));
        ComparePsbtData(
            src_item->value, src_item->value_len, dst_item->value,
            dst_item->value_len, item_name, key.GetHex(),
            ignore_duplicate_error);
        break;
      }
    }
    if (!is_find) regist_indexes.push_back(dst_idx);
  }
  if (!regist_indexes.empty()) {
    for (auto dst_idx : regist_indexes) {
      auto dst_item = &dst->items[dst_idx];
      ret = wally_map_add(
          src, dst_item->key, dst_item->key_len, dst_item->value,
          dst_item->value_len);
      if (ret != WALLY_OK) {
        warn(CFD_LOG_SOURCE, "wally_map_add NG[{}]", ret);
        throw CfdException(
            kCfdMemoryFullError, "psbt add " + item_name + " error.");
      }
    }

    ret = wally_map_sort(src, 0);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_map_sort NG[{}]", ret);
      throw CfdException(kCfdInternalError, "psbt sort map error.");
    }
  }
}